

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

void __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::on_mouse_down(list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *this,unsigned_long btn,unsigned_long state,long x,long y,bool is_double_click)

{
  bool bVar1;
  data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *pdVar2;
  unsigned_long uVar3;
  data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  rectangle *prVar33;
  bool *pbVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *pdVar38;
  long lVar39;
  _Head_base<0UL,_dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_*,_false>
  _Var40;
  undefined1 auVar41 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar61;
  int iVar64;
  int iVar65;
  undefined1 auVar62 [16];
  int iVar66;
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  int iVar80;
  int iVar84;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  
  prVar33 = scrollable_region::display_rect(&this->super_scrollable_region);
  if ((((btn != 1) || (x < prVar33->l)) || (prVar33->r < x)) ||
     (((y < prVar33->t || (prVar33->b < y)) ||
      (((this->super_scrollable_region).super_drawable.enabled != true ||
       ((this->super_scrollable_region).super_drawable.hidden != false)))))) {
    return;
  }
  if (((state & 0x18) == 0) || (this->ms_enabled == false)) {
    (this->items)._at_start = true;
    (this->items).pos =
         (data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          *)0x0;
    pdVar2 = (this->items).last_pos;
    uVar3 = (this->items).array_size;
    pdVar4 = (this->items).array_elements;
    bVar1 = true;
    pdVar38 = (data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *)0x0;
    do {
      if (bVar1) {
        (this->items)._at_start = false;
        if (uVar3 == 0) break;
        bVar1 = false;
        pdVar38 = pdVar4;
      }
      else {
        if (pdVar2 <= pdVar38) {
          (this->items).pos =
               (data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *)0x0;
          break;
        }
        pdVar38 = pdVar38 + 1;
      }
      (this->items).pos = pdVar38;
      pdVar38->is_selected = false;
    } while( true );
  }
  prVar33 = scrollable_region::total_rect(&this->super_scrollable_region);
  auVar32 = _DAT_002c7d10;
  auVar31 = _DAT_002c7d00;
  auVar30 = _DAT_002c7cf0;
  auVar29 = _DAT_002c7ce0;
  auVar28 = _DAT_002af910;
  auVar27 = _DAT_002af900;
  auVar26 = _DAT_002af8f0;
  uVar36 = (this->items).array_size;
  if (uVar36 != 0) {
    pdVar2 = (this->items).array_elements;
    pbVar34 = &pdVar2->is_selected;
    lVar39 = 0;
    uVar37 = 0;
    do {
      lVar39 = lVar39 + *(unsigned_long *)(pbVar34 + 0x10);
      if (y - prVar33->t <= lVar39) {
        if (this->ms_enabled == true) {
          if ((state & 0x10) != 0) {
            bVar1 = *pbVar34;
            *pbVar34 = (bool)(bVar1 ^ 1);
            if (bVar1 == false) {
              this->last_selected = uVar37;
            }
            break;
          }
          if ((state & 8) != 0) {
            uVar36 = this->last_selected;
            uVar35 = uVar37;
            if (uVar36 < uVar37) {
              uVar35 = uVar36;
            }
            if (uVar36 < uVar37) {
              uVar36 = uVar37;
            }
            uVar37 = uVar36 + 1;
            if (uVar36 + 1 < uVar35 + 1) {
              uVar37 = uVar35 + 1;
            }
            lVar39 = (uVar37 - uVar35) + -1;
            auVar41._8_4_ = (int)lVar39;
            auVar41._0_8_ = lVar39;
            auVar41._12_4_ = (int)((ulong)lVar39 >> 0x20);
            pbVar34 = &pdVar2[uVar35 + 0xf].is_selected;
            uVar36 = 0;
            do {
              auVar59._8_4_ = (int)uVar36;
              auVar59._0_8_ = uVar36;
              auVar59._12_4_ = (int)(uVar36 >> 0x20);
              auVar62 = auVar41 ^ auVar28;
              auVar67 = (auVar59 | auVar27) ^ auVar28;
              iVar61 = auVar62._0_4_;
              iVar80 = -(uint)(iVar61 < auVar67._0_4_);
              iVar64 = auVar62._4_4_;
              auVar69._4_4_ = -(uint)(iVar64 < auVar67._4_4_);
              iVar65 = auVar62._8_4_;
              iVar84 = -(uint)(iVar65 < auVar67._8_4_);
              iVar66 = auVar62._12_4_;
              auVar69._12_4_ = -(uint)(iVar66 < auVar67._12_4_);
              auVar42._4_4_ = iVar80;
              auVar42._0_4_ = iVar80;
              auVar42._8_4_ = iVar84;
              auVar42._12_4_ = iVar84;
              auVar42 = pshuflw(in_XMM1,auVar42,0xe8);
              auVar68._4_4_ = -(uint)(auVar67._4_4_ == iVar64);
              auVar68._12_4_ = -(uint)(auVar67._12_4_ == iVar66);
              auVar68._0_4_ = auVar68._4_4_;
              auVar68._8_4_ = auVar68._12_4_;
              auVar51 = pshuflw(in_XMM2,auVar68,0xe8);
              auVar69._0_4_ = auVar69._4_4_;
              auVar69._8_4_ = auVar69._12_4_;
              auVar67 = pshuflw(auVar42,auVar69,0xe8);
              auVar62._8_4_ = 0xffffffff;
              auVar62._0_8_ = 0xffffffffffffffff;
              auVar62._12_4_ = 0xffffffff;
              auVar62 = (auVar67 | auVar51 & auVar42) ^ auVar62;
              auVar62 = packssdw(auVar62,auVar62);
              if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                pbVar34[-0x348] = true;
              }
              auVar51._4_4_ = iVar80;
              auVar51._0_4_ = iVar80;
              auVar51._8_4_ = iVar84;
              auVar51._12_4_ = iVar84;
              auVar69 = auVar68 & auVar51 | auVar69;
              auVar62 = packssdw(auVar69,auVar69);
              auVar67._8_4_ = 0xffffffff;
              auVar67._0_8_ = 0xffffffffffffffff;
              auVar67._12_4_ = 0xffffffff;
              auVar62 = packssdw(auVar62 ^ auVar67,auVar62 ^ auVar67);
              auVar62 = packsswb(auVar62,auVar62);
              if ((auVar62._0_4_ >> 8 & 1) != 0) {
                pbVar34[-0x310] = true;
              }
              auVar62 = (auVar59 | auVar26) ^ auVar28;
              auVar52._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
              auVar52._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
              auVar52._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
              auVar52._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
              auVar70._4_4_ = auVar52._0_4_;
              auVar70._0_4_ = auVar52._0_4_;
              auVar70._8_4_ = auVar52._8_4_;
              auVar70._12_4_ = auVar52._8_4_;
              iVar80 = -(uint)(auVar62._4_4_ == iVar64);
              iVar84 = -(uint)(auVar62._12_4_ == iVar66);
              auVar14._4_4_ = iVar80;
              auVar14._0_4_ = iVar80;
              auVar14._8_4_ = iVar84;
              auVar14._12_4_ = iVar84;
              auVar81._4_4_ = auVar52._4_4_;
              auVar81._0_4_ = auVar52._4_4_;
              auVar81._8_4_ = auVar52._12_4_;
              auVar81._12_4_ = auVar52._12_4_;
              auVar62 = auVar14 & auVar70 | auVar81;
              auVar62 = packssdw(auVar62,auVar62);
              auVar5._8_4_ = 0xffffffff;
              auVar5._0_8_ = 0xffffffffffffffff;
              auVar5._12_4_ = 0xffffffff;
              auVar62 = packssdw(auVar62 ^ auVar5,auVar62 ^ auVar5);
              auVar62 = packsswb(auVar62,auVar62);
              if ((auVar62._0_4_ >> 0x10 & 1) != 0) {
                pbVar34[-0x2d8] = true;
              }
              auVar62 = pshufhw(auVar62,auVar70,0x84);
              auVar15._4_4_ = iVar80;
              auVar15._0_4_ = iVar80;
              auVar15._8_4_ = iVar84;
              auVar15._12_4_ = iVar84;
              auVar67 = pshufhw(auVar52,auVar15,0x84);
              auVar42 = pshufhw(auVar62,auVar81,0x84);
              auVar43._8_4_ = 0xffffffff;
              auVar43._0_8_ = 0xffffffffffffffff;
              auVar43._12_4_ = 0xffffffff;
              auVar43 = (auVar42 | auVar67 & auVar62) ^ auVar43;
              auVar62 = packssdw(auVar43,auVar43);
              auVar62 = packsswb(auVar62,auVar62);
              if ((auVar62._0_4_ >> 0x18 & 1) != 0) {
                pbVar34[-0x2a0] = true;
              }
              auVar62 = (auVar59 | auVar32) ^ auVar28;
              auVar53._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
              auVar53._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
              auVar53._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
              auVar53._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
              auVar16._4_4_ = auVar53._0_4_;
              auVar16._0_4_ = auVar53._0_4_;
              auVar16._8_4_ = auVar53._8_4_;
              auVar16._12_4_ = auVar53._8_4_;
              auVar67 = pshuflw(auVar81,auVar16,0xe8);
              auVar44._0_4_ = -(uint)(auVar62._0_4_ == iVar61);
              auVar44._4_4_ = -(uint)(auVar62._4_4_ == iVar64);
              auVar44._8_4_ = -(uint)(auVar62._8_4_ == iVar65);
              auVar44._12_4_ = -(uint)(auVar62._12_4_ == iVar66);
              auVar71._4_4_ = auVar44._4_4_;
              auVar71._0_4_ = auVar44._4_4_;
              auVar71._8_4_ = auVar44._12_4_;
              auVar71._12_4_ = auVar44._12_4_;
              auVar62 = pshuflw(auVar44,auVar71,0xe8);
              auVar72._4_4_ = auVar53._4_4_;
              auVar72._0_4_ = auVar53._4_4_;
              auVar72._8_4_ = auVar53._12_4_;
              auVar72._12_4_ = auVar53._12_4_;
              auVar42 = pshuflw(auVar53,auVar72,0xe8);
              auVar6._8_4_ = 0xffffffff;
              auVar6._0_8_ = 0xffffffffffffffff;
              auVar6._12_4_ = 0xffffffff;
              auVar62 = packssdw(auVar62 & auVar67,(auVar42 | auVar62 & auVar67) ^ auVar6);
              auVar62 = packsswb(auVar62,auVar62);
              if ((auVar62 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                pbVar34[-0x268] = true;
              }
              auVar17._4_4_ = auVar53._0_4_;
              auVar17._0_4_ = auVar53._0_4_;
              auVar17._8_4_ = auVar53._8_4_;
              auVar17._12_4_ = auVar53._8_4_;
              auVar72 = auVar71 & auVar17 | auVar72;
              auVar42 = packssdw(auVar72,auVar72);
              auVar7._8_4_ = 0xffffffff;
              auVar7._0_8_ = 0xffffffffffffffff;
              auVar7._12_4_ = 0xffffffff;
              auVar62 = packssdw(auVar62,auVar42 ^ auVar7);
              auVar62 = packsswb(auVar62,auVar62);
              if ((auVar62._4_2_ >> 8 & 1) != 0) {
                pbVar34[-0x230] = true;
              }
              auVar62 = (auVar59 | auVar31) ^ auVar28;
              auVar54._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
              auVar54._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
              auVar54._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
              auVar54._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
              auVar73._4_4_ = auVar54._0_4_;
              auVar73._0_4_ = auVar54._0_4_;
              auVar73._8_4_ = auVar54._8_4_;
              auVar73._12_4_ = auVar54._8_4_;
              iVar80 = -(uint)(auVar62._4_4_ == iVar64);
              iVar84 = -(uint)(auVar62._12_4_ == iVar66);
              auVar18._4_4_ = iVar80;
              auVar18._0_4_ = iVar80;
              auVar18._8_4_ = iVar84;
              auVar18._12_4_ = iVar84;
              auVar82._4_4_ = auVar54._4_4_;
              auVar82._0_4_ = auVar54._4_4_;
              auVar82._8_4_ = auVar54._12_4_;
              auVar82._12_4_ = auVar54._12_4_;
              auVar62 = auVar18 & auVar73 | auVar82;
              auVar62 = packssdw(auVar62,auVar62);
              auVar8._8_4_ = 0xffffffff;
              auVar8._0_8_ = 0xffffffffffffffff;
              auVar8._12_4_ = 0xffffffff;
              auVar62 = packssdw(auVar62 ^ auVar8,auVar62 ^ auVar8);
              auVar62 = packsswb(auVar62,auVar62);
              if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                pbVar34[-0x1f8] = true;
              }
              auVar62 = pshufhw(auVar62,auVar73,0x84);
              auVar19._4_4_ = iVar80;
              auVar19._0_4_ = iVar80;
              auVar19._8_4_ = iVar84;
              auVar19._12_4_ = iVar84;
              auVar67 = pshufhw(auVar54,auVar19,0x84);
              auVar42 = pshufhw(auVar62,auVar82,0x84);
              auVar45._8_4_ = 0xffffffff;
              auVar45._0_8_ = 0xffffffffffffffff;
              auVar45._12_4_ = 0xffffffff;
              auVar45 = (auVar42 | auVar67 & auVar62) ^ auVar45;
              auVar62 = packssdw(auVar45,auVar45);
              auVar62 = packsswb(auVar62,auVar62);
              if ((auVar62._6_2_ >> 8 & 1) != 0) {
                pbVar34[-0x1c0] = true;
              }
              auVar62 = (auVar59 | auVar30) ^ auVar28;
              auVar55._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
              auVar55._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
              auVar55._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
              auVar55._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
              auVar20._4_4_ = auVar55._0_4_;
              auVar20._0_4_ = auVar55._0_4_;
              auVar20._8_4_ = auVar55._8_4_;
              auVar20._12_4_ = auVar55._8_4_;
              auVar67 = pshuflw(auVar82,auVar20,0xe8);
              auVar46._0_4_ = -(uint)(auVar62._0_4_ == iVar61);
              auVar46._4_4_ = -(uint)(auVar62._4_4_ == iVar64);
              auVar46._8_4_ = -(uint)(auVar62._8_4_ == iVar65);
              auVar46._12_4_ = -(uint)(auVar62._12_4_ == iVar66);
              auVar74._4_4_ = auVar46._4_4_;
              auVar74._0_4_ = auVar46._4_4_;
              auVar74._8_4_ = auVar46._12_4_;
              auVar74._12_4_ = auVar46._12_4_;
              auVar62 = pshuflw(auVar46,auVar74,0xe8);
              auVar75._4_4_ = auVar55._4_4_;
              auVar75._0_4_ = auVar55._4_4_;
              auVar75._8_4_ = auVar55._12_4_;
              auVar75._12_4_ = auVar55._12_4_;
              auVar42 = pshuflw(auVar55,auVar75,0xe8);
              auVar56._8_4_ = 0xffffffff;
              auVar56._0_8_ = 0xffffffffffffffff;
              auVar56._12_4_ = 0xffffffff;
              auVar56 = (auVar42 | auVar62 & auVar67) ^ auVar56;
              auVar42 = packssdw(auVar56,auVar56);
              auVar62 = packsswb(auVar62 & auVar67,auVar42);
              if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                pbVar34[-0x188] = true;
              }
              auVar21._4_4_ = auVar55._0_4_;
              auVar21._0_4_ = auVar55._0_4_;
              auVar21._8_4_ = auVar55._8_4_;
              auVar21._12_4_ = auVar55._8_4_;
              auVar75 = auVar74 & auVar21 | auVar75;
              auVar42 = packssdw(auVar75,auVar75);
              auVar9._8_4_ = 0xffffffff;
              auVar9._0_8_ = 0xffffffffffffffff;
              auVar9._12_4_ = 0xffffffff;
              auVar42 = packssdw(auVar42 ^ auVar9,auVar42 ^ auVar9);
              auVar62 = packsswb(auVar62,auVar42);
              if ((auVar62._8_2_ >> 8 & 1) != 0) {
                pbVar34[-0x150] = true;
              }
              auVar62 = (auVar59 | auVar29) ^ auVar28;
              auVar57._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
              auVar57._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
              auVar57._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
              auVar57._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
              auVar76._4_4_ = auVar57._0_4_;
              auVar76._0_4_ = auVar57._0_4_;
              auVar76._8_4_ = auVar57._8_4_;
              auVar76._12_4_ = auVar57._8_4_;
              iVar80 = -(uint)(auVar62._4_4_ == iVar64);
              iVar84 = -(uint)(auVar62._12_4_ == iVar66);
              auVar22._4_4_ = iVar80;
              auVar22._0_4_ = iVar80;
              auVar22._8_4_ = iVar84;
              auVar22._12_4_ = iVar84;
              auVar83._4_4_ = auVar57._4_4_;
              auVar83._0_4_ = auVar57._4_4_;
              auVar83._8_4_ = auVar57._12_4_;
              auVar83._12_4_ = auVar57._12_4_;
              auVar62 = auVar22 & auVar76 | auVar83;
              auVar62 = packssdw(auVar62,auVar62);
              auVar10._8_4_ = 0xffffffff;
              auVar10._0_8_ = 0xffffffffffffffff;
              auVar10._12_4_ = 0xffffffff;
              auVar62 = packssdw(auVar62 ^ auVar10,auVar62 ^ auVar10);
              auVar62 = packsswb(auVar62,auVar62);
              if ((auVar62 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                pbVar34[-0x118] = true;
              }
              auVar62 = pshufhw(auVar62,auVar76,0x84);
              auVar23._4_4_ = iVar80;
              auVar23._0_4_ = iVar80;
              auVar23._8_4_ = iVar84;
              auVar23._12_4_ = iVar84;
              auVar67 = pshufhw(auVar57,auVar23,0x84);
              auVar42 = pshufhw(auVar62,auVar83,0x84);
              auVar47._8_4_ = 0xffffffff;
              auVar47._0_8_ = 0xffffffffffffffff;
              auVar47._12_4_ = 0xffffffff;
              auVar47 = (auVar42 | auVar67 & auVar62) ^ auVar47;
              auVar62 = packssdw(auVar47,auVar47);
              auVar62 = packsswb(auVar62,auVar62);
              if ((auVar62._10_2_ >> 8 & 1) != 0) {
                pbVar34[-0xe0] = true;
              }
              auVar62 = (auVar59 | _DAT_002c7cd0) ^ auVar28;
              auVar58._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
              auVar58._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
              auVar58._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
              auVar58._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
              auVar24._4_4_ = auVar58._0_4_;
              auVar24._0_4_ = auVar58._0_4_;
              auVar24._8_4_ = auVar58._8_4_;
              auVar24._12_4_ = auVar58._8_4_;
              auVar67 = pshuflw(auVar83,auVar24,0xe8);
              auVar48._0_4_ = -(uint)(auVar62._0_4_ == iVar61);
              auVar48._4_4_ = -(uint)(auVar62._4_4_ == iVar64);
              auVar48._8_4_ = -(uint)(auVar62._8_4_ == iVar65);
              auVar48._12_4_ = -(uint)(auVar62._12_4_ == iVar66);
              auVar77._4_4_ = auVar48._4_4_;
              auVar77._0_4_ = auVar48._4_4_;
              auVar77._8_4_ = auVar48._12_4_;
              auVar77._12_4_ = auVar48._12_4_;
              auVar62 = pshuflw(auVar48,auVar77,0xe8);
              auVar78._4_4_ = auVar58._4_4_;
              auVar78._0_4_ = auVar58._4_4_;
              auVar78._8_4_ = auVar58._12_4_;
              auVar78._12_4_ = auVar58._12_4_;
              auVar42 = pshuflw(auVar58,auVar78,0xe8);
              auVar11._8_4_ = 0xffffffff;
              auVar11._0_8_ = 0xffffffffffffffff;
              auVar11._12_4_ = 0xffffffff;
              auVar62 = packssdw(auVar62 & auVar67,(auVar42 | auVar62 & auVar67) ^ auVar11);
              auVar62 = packsswb(auVar62,auVar62);
              if ((auVar62 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                pbVar34[-0xa8] = true;
              }
              auVar25._4_4_ = auVar58._0_4_;
              auVar25._0_4_ = auVar58._0_4_;
              auVar25._8_4_ = auVar58._8_4_;
              auVar25._12_4_ = auVar58._8_4_;
              auVar78 = auVar77 & auVar25 | auVar78;
              auVar42 = packssdw(auVar78,auVar78);
              auVar12._8_4_ = 0xffffffff;
              auVar12._0_8_ = 0xffffffffffffffff;
              auVar12._12_4_ = 0xffffffff;
              auVar62 = packssdw(auVar62,auVar42 ^ auVar12);
              auVar62 = packsswb(auVar62,auVar62);
              if ((auVar62._12_2_ >> 8 & 1) != 0) {
                pbVar34[-0x70] = true;
              }
              auVar62 = (auVar59 | _DAT_002c7cc0) ^ auVar28;
              auVar49._0_4_ = -(uint)(iVar61 < auVar62._0_4_);
              auVar49._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
              auVar49._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
              auVar49._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
              auVar79._4_4_ = auVar49._0_4_;
              auVar79._0_4_ = auVar49._0_4_;
              auVar79._8_4_ = auVar49._8_4_;
              auVar79._12_4_ = auVar49._8_4_;
              auVar60._4_4_ = -(uint)(auVar62._4_4_ == iVar64);
              auVar60._12_4_ = -(uint)(auVar62._12_4_ == iVar66);
              auVar60._0_4_ = auVar60._4_4_;
              auVar60._8_4_ = auVar60._12_4_;
              auVar63._4_4_ = auVar49._4_4_;
              auVar63._0_4_ = auVar49._4_4_;
              auVar63._8_4_ = auVar49._12_4_;
              auVar63._12_4_ = auVar49._12_4_;
              auVar42 = auVar60 & auVar79 | auVar63;
              auVar62 = packssdw(auVar49,auVar42);
              auVar13._8_4_ = 0xffffffff;
              auVar13._0_8_ = 0xffffffffffffffff;
              auVar13._12_4_ = 0xffffffff;
              auVar62 = packssdw(auVar62 ^ auVar13,auVar62 ^ auVar13);
              auVar62 = packsswb(auVar62,auVar62);
              if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                pbVar34[-0x38] = true;
              }
              auVar62 = pshufhw(auVar62,auVar79,0x84);
              in_XMM2 = pshufhw(auVar42,auVar60,0x84);
              in_XMM2 = in_XMM2 & auVar62;
              auVar62 = pshufhw(auVar62,auVar63,0x84);
              auVar50._8_4_ = 0xffffffff;
              auVar50._0_8_ = 0xffffffffffffffff;
              auVar50._12_4_ = 0xffffffff;
              auVar50 = (auVar62 | in_XMM2) ^ auVar50;
              auVar62 = packssdw(auVar50,auVar50);
              in_XMM1 = packsswb(auVar62,auVar62);
              if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                *pbVar34 = true;
              }
              uVar36 = uVar36 + 0x10;
              pbVar34 = pbVar34 + 0x380;
            } while (((uVar37 - uVar35) + 0xf & 0xfffffffffffffff0) != uVar36);
            break;
          }
        }
        *pbVar34 = true;
        this->last_selected = uVar37;
        if (((is_double_click) &&
            (_Var40._M_head_impl =
                  (this->event_handler).data._M_t.
                  super___uniq_ptr_impl<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>,_std::default_delete<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_*,_std::default_delete<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_>_>
                  .
                  super__Head_base<0UL,_dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_*,_false>
                  ._M_head_impl, _Var40._M_head_impl != (Tbase<void_(unsigned_long)> *)0x0)) ||
           (_Var40._M_head_impl =
                 (this->single_click_event_handler).data._M_t.
                 super___uniq_ptr_impl<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>,_std::default_delete<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_*,_std::default_delete<dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_>_>
                 .
                 super__Head_base<0UL,_dlib::any_function<void_(unsigned_long),_void,_1UL>::Tbase<void_(unsigned_long)>_*,_false>
                 ._M_head_impl, _Var40._M_head_impl != (Tbase<void_(unsigned_long)> *)0x0)) {
          (*(_Var40._M_head_impl)->_vptr_Tbase[2])();
        }
        break;
      }
      uVar37 = uVar37 + 1;
      pbVar34 = pbVar34 + 0x38;
    } while (uVar36 != uVar37);
  }
  base_window::invalidate_rectangle
            (&((this->super_scrollable_region).super_drawable.parent)->super_base_window,
             &(this->super_scrollable_region).super_drawable.rect);
  return;
}

Assistant:

void list_box<S>::
    on_mouse_down (
        unsigned long btn,
        unsigned long state,
        long x,
        long y,
        bool is_double_click
    )
    {
        if (display_rect().contains(x,y) && btn == base_window::LEFT && enabled && !hidden )
        {
            if ( ms_enabled == false || 
                 ((!(state&base_window::CONTROL)) && !(state&base_window::SHIFT)))
            {
                items.reset();
                while (items.move_next())
                {
                    items.element().is_selected = false;
                }
            }

            y -= total_rect().top();
            long h = 0;
            for (unsigned long i = 0; i < items.size(); ++i)
            {
                h += items[i].height;
                if (h >= y)
                {
                    if (ms_enabled)
                    {
                        if (state&base_window::CONTROL)
                        {
                            items[i].is_selected = !items[i].is_selected;
                            if (items[i].is_selected)
                                last_selected = i;
                        }
                        else if (state&base_window::SHIFT)
                        {
                            // we want to select everything between (and including) the
                            // current thing clicked and last_selected.
                            const unsigned long first = std::min(i,last_selected);
                            const unsigned long last = std::max(i,last_selected);
                            for (unsigned long j = first; j <= last; ++j)
                                items[j].is_selected = true;
                        }
                        else
                        {
                            items[i].is_selected = true;
                            last_selected = i;
                            if (is_double_click && event_handler.is_set())
                                event_handler(i);
                            else if (single_click_event_handler.is_set())
                                single_click_event_handler(i);
                        }
                    }
                    else
                    {
                        items[i].is_selected = true;
                        last_selected = i;
                        if (is_double_click && event_handler.is_set())
                            event_handler(i);
                        else if (single_click_event_handler.is_set())
                            single_click_event_handler(i);
                    }

                    break;
                }
            }

            parent.invalidate_rectangle(rect);
        }
    }